

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Eq,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
::find_or_prepare_insert_non_soo<google::protobuf::EnumValueDescriptor_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Eq,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
          *this,EnumValueDescriptor **key)

{
  bool bVar1;
  h2_t hash_00;
  hasher *this_00;
  CommonFields *pCVar2;
  ctrl_t *pcVar3;
  size_t sVar4;
  slot_type *ppEVar5;
  EnumValueDescriptor **ts;
  size_t capacity;
  PolicyFunctions *pPVar6;
  char *pcVar7;
  char *pcVar8;
  int __c;
  int __c_00;
  NonIterableBitMask<unsigned_short,_16,_0> *b;
  PolicyFunctions *in_R9;
  FindInfo target_00;
  uint local_12c;
  bool local_e9;
  size_t local_e8;
  char *local_e0;
  iterator local_d8;
  unsigned_short local_c2;
  size_t local_c0;
  size_t target;
  undefined1 auStack_b0 [4];
  NonIterableBitMask<unsigned_short,_16,_0> mask_empty;
  EqualElement<const_google::protobuf::EnumValueDescriptor_*> local_a0;
  uint32_t local_8c;
  NonIterableBitMask<unsigned_short,_16,_0> local_86;
  uint32_t i;
  BitMask<unsigned_short,_16,_0,_false> __end0;
  BitMask<unsigned_short,_16,_0,_false> __begin0;
  BitMask<unsigned_short,_16,_0,_false> *pBStack_80;
  BitMask<unsigned_short,_16,_0,_false> *__range5;
  Group g;
  ctrl_t *ctrl;
  probe_seq<16UL> seq;
  size_t hash;
  EnumValueDescriptor **key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *this_local;
  NonIterableBitMask<unsigned_short,_16,_0> local_a;
  
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    *)this);
  if (bVar1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Eq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = const google::protobuf::EnumValueDescriptor *]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              *)this);
  this_00 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ::hash_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                        *)this);
  seq.index_ = HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Hash::operator()
                         ((Hash *)this_00,key);
  pCVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           ::common((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                     *)this);
  probe((probe_seq<16UL> *)&ctrl,pCVar2,seq.index_);
  pcVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      *)this);
  do {
    sVar4 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl);
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)&__range5,pcVar3 + sVar4);
    hash_00 = H2(seq.index_);
    i._2_2_ = (unsigned_short)GroupSse2Impl::Match((GroupSse2Impl *)&__range5,hash_00);
    pBStack_80 = (BitMask<unsigned_short,_16,_0,_false> *)((long)&i + 2);
    i._0_2_ = (unsigned_short)BitMask<unsigned_short,_16,_0,_false>::begin(pBStack_80);
    local_86.mask_ = (unsigned_short)BitMask<unsigned_short,_16,_0,_false>::end(pBStack_80);
    while( true ) {
      b = &local_86;
      bVar1 = container_internal::operator!=
                        ((BitMask<unsigned_short,_16,_0,_false> *)&i,
                         (BitMask<unsigned_short,_16,_0,_false> *)b);
      if (!bVar1) break;
      local_8c = BitMask<unsigned_short,_16,_0,_false>::operator*
                           ((BitMask<unsigned_short,_16,_0,_false> *)&i);
      local_a0.rhs = key;
      local_a0.eq = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    ::eq_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                              *)this);
      ppEVar5 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                              *)this);
      sVar4 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl,(ulong)local_8c);
      ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,void>
           ::
           element<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>>
                     ((remove_const_t<slot_type>_conflict1 *)(ppEVar5 + sVar4));
      bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::EnumValueDescriptor_const*,void>::Eq,std::allocator<google::protobuf::EnumValueDescriptor_const*>>::EqualElement<google::protobuf::EnumValueDescriptor_const*>,google::protobuf::EnumValueDescriptor_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>>
                        (&local_a0,ts);
      if (bVar1) {
        sVar4 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl,(ulong)local_8c);
        _auStack_b0 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                     *)this,sVar4);
        target._7_1_ = 0;
        std::
        pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
        ::
        pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool,_true>
                  (__return_storage_ptr__,(iterator *)auStack_b0,(bool *)((long)&target + 7));
        return __return_storage_ptr__;
      }
      BitMask<unsigned_short,_16,_0,_false>::operator++((BitMask<unsigned_short,_16,_0,_false> *)&i)
      ;
    }
    target._4_2_ = GroupSse2Impl::MaskEmpty((GroupSse2Impl *)&__range5);
    bVar1 = NonIterableBitMask::operator_cast_to_bool((NonIterableBitMask *)((long)&target + 4));
    if (bVar1) {
      local_c2 = target._4_2_;
      capacity = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                             *)this);
      sVar4 = seq.index_;
      pcVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                          *)this);
      local_a.mask_ = local_c2;
      bVar1 = ShouldInsertBackwardsForDebug(capacity,sVar4,pcVar3);
      if (bVar1) {
        local_12c = NonIterableBitMask<unsigned_short,_16,_0>::HighestBitSet(&local_a);
      }
      else {
        local_12c = NonIterableBitMask<unsigned_short,_16,_0>::LowestBitSet(&local_a);
      }
      pcVar7 = (char *)(ulong)local_12c;
      local_c0 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl,(size_t)pcVar7);
      pCVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ::common((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                         *)this);
      sVar4 = seq.index_;
      local_e8 = local_c0;
      local_e0 = probe_seq<16UL>::index((probe_seq<16UL> *)&ctrl,pcVar7,__c);
      pPVar6 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ::GetPolicyFunctions();
      target_00.probe_length = (size_t)pPVar6;
      target_00.offset = (size_t)local_e0;
      sVar4 = PrepareInsertNonSoo((container_internal *)pCVar2,(CommonFields *)sVar4,local_e8,
                                  target_00,in_R9);
      local_d8 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                *)this,sVar4);
      local_e9 = true;
      std::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
      ::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool,_true>
                (__return_storage_ptr__,&local_d8,&local_e9);
      return __return_storage_ptr__;
    }
    probe_seq<16UL>::next((probe_seq<16UL> *)&ctrl);
    pcVar7 = probe_seq<16UL>::index((probe_seq<16UL> *)&ctrl,(char *)b,__c_00);
    pcVar8 = (char *)raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                     ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::EnumValueDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                 *)this);
  } while (pcVar7 <= pcVar8);
  __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf7d,
                "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Eq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::EnumValueDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = const google::protobuf::EnumValueDescriptor *]"
               );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }